

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

xmlChar * xmlEscapePropValue(char *str)

{
  _Bool _Var1;
  uint ucs_00;
  xmlChar *in_RDI;
  int i;
  int ucs;
  int utfLen;
  uchar *itEnd;
  uchar *it;
  xmlChar *retEnd;
  xmlChar *retPos;
  xmlChar *ret;
  size_t retLen;
  size_t len;
  int local_4c;
  int local_44;
  xmlChar *local_40;
  xmlChar *local_38;
  xmlChar *local_30;
  xmlChar *local_28;
  xmlChar *local_20;
  long local_18;
  size_t local_10;
  xmlChar *local_8;
  
  local_8 = in_RDI;
  local_10 = strlen((char *)in_RDI);
  local_18 = local_10 * 4 + 1;
  local_28 = (xmlChar *)(*_xmlMalloc)(local_18);
  local_30 = local_28 + local_18;
  local_20 = local_28;
  if (local_28 != (xmlChar *)0x0) {
    local_38 = local_8;
    local_40 = local_8 + local_10;
    while (*local_38 != '\0') {
      local_44 = (int)local_40 - (int)local_38;
      ucs_00 = xmlGetUTF8Char(local_38,&local_44);
      if (ucs_00 == 0xffffffff) {
        xmlStrPrintf(local_28,(int)local_30 - (int)local_28,"\\x%.2x",*local_38);
        local_28 = local_28 + 4;
        local_38 = local_38 + 1;
      }
      else {
        _Var1 = isOverlongUTF8(ucs_00,local_44);
        if (_Var1) {
          for (local_4c = 0; local_4c < local_44; local_4c = local_4c + 1) {
            xmlStrPrintf(local_28,(int)local_30 - (int)local_28,"\\x%.2x",*local_38);
            local_28 = local_28 + 4;
            local_38 = local_38 + 1;
          }
        }
        else {
          _Var1 = isNonRestrictedXMLChar(ucs_00);
          if (_Var1) {
            while (local_44 != 0) {
              *local_28 = *local_38;
              local_44 = local_44 + -1;
              local_38 = local_38 + 1;
              local_28 = local_28 + 1;
            }
          }
          else {
            xmlStrPrintf(local_28,(int)local_30 - (int)local_28,"&x%x;",ucs_00);
          }
        }
      }
    }
    *local_28 = '\0';
    return local_20;
  }
  fprintf(_stderr,"memory allocation failure in %s\n","xmlEscapePropValue");
  exit(1);
}

Assistant:

static xmlChar* xmlEscapePropValue(const char *str) {
    size_t len = strlen(str);
    /*
     * The worst-case length of the output is 4 times the input length (if
     * every input byte has to be escaped) plus 1 for the terminating NUL
     * character
     */
    size_t retLen = len * 4 + 1;
    xmlChar* ret = xmlMalloc(retLen), *retPos = ret, *retEnd = ret + retLen;
    if (!ret) {
        fprintf(stderr, "memory allocation failure in %s\n", __func__);
        exit(EXIT_FAILURE);
    }

    const unsigned char *it = (const unsigned char*)str;
    const unsigned char *itEnd = it + len;
    while (*it) {
        int utfLen = itEnd - it;
        int ucs = xmlGetUTF8Char(it, &utfLen);
        if (ucs != -1) {
            if (!isOverlongUTF8(ucs, utfLen)) {
                if (isNonRestrictedXMLChar(ucs)) {
                    /* Valid UTF8 sequence of an allowed character */
                    while (utfLen--)
                        *retPos++ = *it++;
                } else {
                    xmlStrPrintf(retPos, retEnd - retPos, "&x%x;", ucs);
                }
            } else {
                /* Disallowed character or overlong UTF8, escape entire sequence */
                for(int i = 0;i < utfLen;++i) {
                    xmlStrPrintf(retPos, retEnd-retPos, "\\x%.2" PRIx8, *it);
                    retPos += 4;
                    ++it;
                }
            }
        } else {
            /* Invalid UTF8, escape one byte then try to parse rest of input as UTF8 again */
            xmlStrPrintf(retPos, retEnd-retPos, "\\x%.2" PRIx8, *it);
            retPos += 4;
            ++it;
        }
    }

    *retPos = '\0';
    return ret;
}